

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O1

void __thiscall Item::Item(Item *this,int grid_width,int grid_height)

{
  (this->super_GameObject).direction = kNone;
  (this->super_GameObject).speed = 0.1;
  (this->super_GameObject).pos_x = -1.0;
  (this->super_GameObject).pos_y = -1.0;
  (this->super_GameObject).object_Type = ObjectItem;
  (this->super_GameObject).grid_width = grid_width;
  (this->super_GameObject).grid_height = grid_height;
  (this->super_GameObject)._vptr_GameObject = (_func_int **)&PTR_ResetPosition_00107d78;
  (this->super_GameObject).field_0x24 = 0;
  ResetPosition(this);
  (this->super_GameObject).speed = 0.0;
  return;
}

Assistant:

Item::Item(int grid_width, int grid_height) : GameObject(ObjectType::ObjectItem, grid_width,  grid_height, -1, -1)
 {  
  ResetPosition();
  
  speed =0.f;
 }